

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

int wallet::TraceSqlCallback(uint code,void *context,void *param1,void *param2)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  LogFlags in_RDX;
  long *in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  char *expanded;
  sqlite3_stmt *stmt;
  SQLiteDatabase *db;
  Level in_stack_000000c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000d0;
  char **in_stack_000000d8;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff30;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff38;
  long local_a8;
  ConstevalFormatString<2U> in_stack_ffffffffffffffc8;
  string_view in_stack_ffffffffffffffd0;
  string_view in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDI == 1) {
    iVar3 = sqlite3_stmt_readonly(in_RDX);
    if (iVar3 == 0) {
      local_a8 = 0;
    }
    else {
      local_a8 = sqlite3_expanded_sql(in_RDX);
    }
    bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),Trace)
    ;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      (**(code **)(*in_RSI + 0x60))(&stack0xffffffffffffffd8);
      iVar3 = (int)((ulong)in_RSI >> 0x20);
      if (local_a8 == 0) {
        sqlite3_sql(in_RDX);
      }
      uVar4 = 0;
      LogPrintFormatInternal<std::__cxx11::string,char_const*>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd0,iVar3,in_RDX,in_stack_000000c0,
                 in_stack_ffffffffffffffc8,in_stack_000000d0,in_stack_000000d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff1c,uVar4));
    }
    if (local_a8 != 0) {
      sqlite3_free(local_a8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

static int TraceSqlCallback(unsigned code, void* context, void* param1, void* param2)
{
    auto* db = static_cast<SQLiteDatabase*>(context);
    if (code == SQLITE_TRACE_STMT) {
        auto* stmt = static_cast<sqlite3_stmt*>(param1);
        // To be conservative and avoid leaking potentially secret information
        // in the log file, only expand statements that query the database, not
        // statements that update the database.
        char* expanded{sqlite3_stmt_readonly(stmt) ? sqlite3_expanded_sql(stmt) : nullptr};
        LogTrace(BCLog::WALLETDB, "[%s] SQLite Statement: %s\n", db->Filename(), expanded ? expanded : sqlite3_sql(stmt));
        if (expanded) sqlite3_free(expanded);
    }
    return SQLITE_OK;
}